

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManComputeFirstArray(If_DsdMan_t *p,int *pLits,int nLits,int *pFirsts)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar4 = uVar3;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pFirsts[uVar3] = iVar2;
    iVar1 = If_DsdVecLitSuppSize(&p->vObjs,pLits[uVar3]);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int If_DsdManComputeFirstArray( If_DsdMan_t * p, int * pLits, int nLits, int * pFirsts )
{
    int i, nSSize = 0;
    for ( i = 0; i < nLits; i++ )
    {
        pFirsts[i] = nSSize;
        nSSize += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    return nSSize;
}